

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# formatters.h
# Opt level: O3

void __thiscall
lwlog::details::hour_clock_24_formatter::~hour_clock_24_formatter(hour_clock_24_formatter *this)

{
  operator_delete(this,8);
  return;
}

Assistant:

void format(std::string& pattern, const record_base& record) const override
		{
			const auto& time_point{ record.time_point() };

			formatter::format_attribute(
				pattern,
				flag::hour_clock_24,
				os::datetime::ensure_two_digit_format(time_point.hour) 
					+ '-'  + os::datetime::ensure_two_digit_format(time_point.minute)
			);
		}